

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_confirmation_hash(uint8_t *out,uint16_t *plaintext,uint16_t *pubkey,uint p,uint q)

{
  ssh_hash *h;
  ssh_hash *psVar1;
  ssh_hashalg *psVar2;
  uint8_t hashdata [64];
  
  h = ssh_hash_new((ssh_hashalg *)out);
  psVar2 = (ssh_hashalg *)h->binarysink_;
  BinarySink_put_byte((BinarySink *)psVar2,'\x02');
  psVar1 = ssh_hash_new(psVar2);
  BinarySink_put_byte(psVar1->binarysink_,'\x03');
  ntru_encode_plaintext(plaintext,p,psVar1->binarysink_);
  ssh_hash_final(psVar1,hashdata);
  psVar2 = (ssh_hashalg *)h->binarysink_;
  BinarySink_put_data((BinarySink *)psVar2,hashdata,0x20);
  psVar1 = ssh_hash_new(psVar2);
  BinarySink_put_byte(psVar1->binarysink_,'\x04');
  ntru_encode_pubkey(pubkey,p,q,psVar1->binarysink_);
  ssh_hash_final(psVar1,hashdata);
  BinarySink_put_data(h->binarysink_,hashdata,0x20);
  ssh_hash_final(h,hashdata);
  *(undefined8 *)(out + 0x10) = hashdata._16_8_;
  *(undefined8 *)(out + 0x18) = hashdata._24_8_;
  *(undefined8 *)out = hashdata._0_8_;
  *(undefined8 *)(out + 8) = hashdata._8_8_;
  smemclr(hashdata,0x40);
  return;
}

Assistant:

void ntru_confirmation_hash(uint8_t *out, const uint16_t *plaintext,
                            const uint16_t *pubkey, unsigned p, unsigned q)
{
    /* The outer hash object */
    ssh_hash *hconfirm = ssh_hash_new(&ssh_sha512);
    put_byte(hconfirm, 2);             /* initial byte 2 */

    uint8_t hashdata[64];

    /* Compute H(3 || r) and add it to the main hash */
    ssh_hash *h3r = ssh_hash_new(&ssh_sha512);
    put_byte(h3r, 3);
    ntru_encode_plaintext(plaintext, p, BinarySink_UPCAST(h3r));
    ssh_hash_final(h3r, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute H(4 || K) and add it to the main hash */
    ssh_hash *h4K = ssh_hash_new(&ssh_sha512);
    put_byte(h4K, 4);
    ntru_encode_pubkey(pubkey, p, q, BinarySink_UPCAST(h4K));
    ssh_hash_final(h4K, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute the full output of the main SHA-512 hash */
    ssh_hash_final(hconfirm, hashdata);

    /* And copy the first 32 bytes into the caller's output array */
    memcpy(out, hashdata, 32);
    smemclr(hashdata, sizeof(hashdata));
}